

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O2

int weapon_type(obj *obj)

{
  int iVar1;
  byte bVar2;
  
  if (obj == (obj *)0x0) {
    iVar1 = 0x25;
  }
  else {
    if (((long)obj->otyp == 0x216) && (urole.malenum == 0x15d)) {
      return (int)objects[0x216].oc_subtyp;
    }
    iVar1 = 0;
    if (((byte)obj->oclass < 0xe) && ((0x2044U >> ((byte)obj->oclass & 0x1f) & 1) != 0)) {
      bVar2 = objects[obj->otyp].oc_subtyp >> 7;
      return (int)(byte)((objects[obj->otyp].oc_subtyp ^ bVar2) - bVar2);
    }
  }
  return iVar1;
}

Assistant:

int weapon_type(const struct obj *obj)
{
	/* KMH -- now uses the object table */
	int type;

	if (!obj)
		/* Not using a weapon */
		return P_BARE_HANDED_COMBAT;
	if (obj->otyp == HEAVY_IRON_BALL && Role_if(PM_CONVICT))
		return objects[obj->otyp].oc_skill;
	if (obj->oclass != WEAPON_CLASS && obj->oclass != TOOL_CLASS &&
	    obj->oclass != GEM_CLASS)
		/* Not a weapon, weapon-tool, or ammo */
		return P_NONE;
	type = objects[obj->otyp].oc_skill;
	return (type < 0) ? -type : type;
}